

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

bool __thiscall Catch::TestSpec::matches(TestSpec *this,TestCaseInfo *testCase)

{
  bool bVar1;
  const_iterator __first;
  const_iterator __last;
  TestCaseInfo *testCase_local;
  TestSpec *this_local;
  
  __first = std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
                      (&this->m_filters);
  __last = std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::end
                     (&this->m_filters);
  bVar1 = std::
          any_of<__gnu_cxx::__normal_iterator<Catch::TestSpec::Filter_const*,std::vector<Catch::TestSpec::Filter,std::allocator<Catch::TestSpec::Filter>>>,Catch::TestSpec::matches(Catch::TestCaseInfo_const&)const::__0>
                    ((__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                      )__first._M_current,
                     (__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
                      )__last._M_current,(anon_class_8_1_a389c060_for__M_pred)testCase);
  return bVar1;
}

Assistant:

bool TestSpec::matches( TestCaseInfo const& testCase ) const {
        return std::any_of( m_filters.begin(), m_filters.end(), [&]( Filter const& f ){ return f.matches( testCase ); } );
    }